

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O1

uint32_t FACTWaveBank_GetWaveProperties
                   (FACTWaveBank *pWaveBank,uint16_t nWaveIndex,FACTWaveProperties *pWaveProperties)

{
  uint uVar1;
  FACTWaveBankEntry *pFVar2;
  uint uVar3;
  uint uVar4;
  
  if (pWaveBank == (FACTWaveBank *)0x0) {
    return 1;
  }
  FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);
  pFVar2 = pWaveBank->entries;
  if (pWaveBank->waveBankNames == (char *)0x0) {
    SDL_memset(pWaveProperties,0,0x40);
  }
  else {
    SDL_memcpy(pWaveProperties,pWaveBank->waveBankNames + (ulong)nWaveIndex * 0x40,0x40);
  }
  pWaveProperties->format =
       *(FACTWaveBankMiniWaveFormat *)((long)&pFVar2->Format + (ulong)((uint)nWaveIndex * 0x18));
  uVar3 = *(uint *)((long)&(pFVar2->PlayRegion).dwLength + (ulong)((uint)nWaveIndex * 0x18));
  pWaveProperties->durationInSamples = uVar3;
  uVar1 = *(uint *)((long)&pFVar2->Format + (ulong)((uint)nWaveIndex * 0x18));
  if ((uVar1 & 3) == 2) {
    uVar4 = uVar1 >> 0x17 & 0xff;
    uVar3 = (uVar4 * 2 + 0x20) * (uVar3 / ((uVar1 >> 2 & 7) * (uVar4 + 0x16)));
  }
  else {
    if ((uVar1 & 3) != 0) goto LAB_0010c55b;
    uVar3 = uVar3 >> (byte)(uVar1 >> 0x1f);
    pWaveProperties->durationInSamples = uVar3;
    uVar3 = uVar3 / (*(uint *)((long)&pFVar2->Format + (ulong)((uint)nWaveIndex * 0x18)) >> 2 & 7);
  }
  pWaveProperties->durationInSamples = uVar3;
LAB_0010c55b:
  pWaveProperties->loopRegion =
       *(FACTWaveBankSampleRegion *)
        ((long)&(pFVar2->LoopRegion).dwStartSample + (ulong)((uint)nWaveIndex * 0x18));
  pWaveProperties->streaming = (uint)pWaveBank->streaming;
  FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
  return 0;
}

Assistant:

uint32_t FACTWaveBank_GetWaveProperties(
	FACTWaveBank *pWaveBank,
	uint16_t nWaveIndex,
	FACTWaveProperties *pWaveProperties
) {
	FACTWaveBankEntry *entry;
	if (pWaveBank == NULL)
	{
		return 1;
	}

	FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);

	entry = &pWaveBank->entries[nWaveIndex];

	if (pWaveBank->waveBankNames)
	{
		FAudio_memcpy(
			pWaveProperties->friendlyName,
			&pWaveBank->waveBankNames[nWaveIndex * 64],
			sizeof(pWaveProperties->friendlyName)
		);
	}
	else
	{
		FAudio_zero(
			pWaveProperties->friendlyName,
			sizeof(pWaveProperties->friendlyName)
		);
	}

	pWaveProperties->format = entry->Format;
	pWaveProperties->durationInSamples = entry->PlayRegion.dwLength;
	if (entry->Format.wFormatTag == 0)
	{
		pWaveProperties->durationInSamples /= (8 << entry->Format.wBitsPerSample) / 8;
		pWaveProperties->durationInSamples /= entry->Format.nChannels;
	}
	else if (entry->Format.wFormatTag == FAUDIO_FORMAT_MSADPCM)
	{
		pWaveProperties->durationInSamples = (
			pWaveProperties->durationInSamples /
			((entry->Format.wBlockAlign + 22) * entry->Format.nChannels) *
			((entry->Format.wBlockAlign + 16) * 2)
		);
	}
	else
	{
		FAudio_assert(0 && "Unrecognized wFormatTag!");
	}

	pWaveProperties->loopRegion = entry->LoopRegion;
	pWaveProperties->streaming = pWaveBank->streaming;

	FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
	return 0;
}